

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall fasttext::SoftmaxLoss::computeOutput(SoftmaxLoss *this,State *state)

{
  Vector *this_00;
  pointer pfVar1;
  undefined1 auVar2 [16];
  int32_t i_1;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int32_t i;
  double dVar6;
  undefined1 auVar7 [64];
  float fVar8;
  
  this_00 = &state->output;
  Vector::mul(this_00,(((this->super_Loss).wo_)->
                      super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
              &state->hidden);
  pfVar1 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar7 = ZEXT464((uint)*pfVar1);
  uVar3 = (uint)((ulong)((long)(state->output).data_.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pfVar1) >> 2);
  uVar5 = (ulong)(~((int)uVar3 >> 0x1f) & uVar3);
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    auVar2 = vmaxss_avx(auVar7._0_16_,ZEXT416((uint)pfVar1[uVar4]));
    auVar7 = ZEXT1664(auVar2);
  }
  fVar8 = 0.0;
  uVar3 = auVar7._0_4_;
  for (uVar4 = 0;
      pfVar1 = (this_00->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start, uVar5 != uVar4; uVar4 = uVar4 + 1) {
    dVar6 = exp((double)(pfVar1[uVar4] - auVar7._0_4_));
    auVar7 = ZEXT464(uVar3);
    (this_00->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] = (float)dVar6;
    fVar8 = fVar8 + (float)dVar6;
  }
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pfVar1[uVar4] = pfVar1[uVar4] / fVar8;
  }
  return;
}

Assistant:

void SoftmaxLoss::computeOutput(Model::State& state) const {
  Vector& output = state.output;
  output.mul(*wo_, state.hidden);
  real max = output[0], z = 0.0;
  int32_t osz = output.size();
  for (int32_t i = 0; i < osz; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz; i++) {
    output[i] /= z;
  }
}